

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-closesocket.c
# Opt level: O0

int run_test_poll_closesocket(void)

{
  fprintf(_stderr,"%s\n","Test only relevant on Windows");
  fflush(_stderr);
  return 1;
}

Assistant:

TEST_IMPL(poll_closesocket) {
#ifndef _WIN32
  RETURN_SKIP("Test only relevant on Windows");
#else
  struct WSAData wsa_data;
  int r;
  unsigned long on;
  struct sockaddr_in addr;

  r = WSAStartup(MAKEWORD(2, 2), &wsa_data);
  ASSERT(r == 0);

  sock = socket(AF_INET, SOCK_STREAM, 0);
  ASSERT(sock != INVALID_SOCKET);
  on = 1;
  r = ioctlsocket(sock, FIONBIO, &on);
  ASSERT(r == 0);

  r = uv_ip4_addr("127.0.0.1", TEST_PORT, &addr);
  ASSERT(r == 0);

  r = connect(sock, (const struct sockaddr*) &addr, sizeof addr);
  ASSERT(r != 0);
  ASSERT(WSAGetLastError() == WSAEWOULDBLOCK);

  r = uv_poll_init_socket(uv_default_loop(), &handle, sock);
  ASSERT(r == 0);
  r = uv_poll_start(&handle, UV_WRITABLE, poll_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}